

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O3

void __thiscall
spdlog::logger::set_pattern(logger *this,string *pattern,pattern_time_type time_type)

{
  element_type *peVar1;
  pointer psVar2;
  long lVar3;
  pointer *__ptr;
  undefined8 uVar4;
  pointer psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_48.field_2._12_4_ = time_type;
  std::make_unique<spdlog::pattern_formatter,std::__cxx11::string,spdlog::pattern_time_type&>
            (&local_48,(pattern_time_type *)pattern);
  uVar4 = local_48._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)0x0;
  psVar5 = (this->sinks_).
           super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->sinks_).
           super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 == psVar2) {
    if ((long *)uVar4 == (long *)0x0) goto LAB_00114cfe;
  }
  else {
    do {
      peVar1 = (psVar5->super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      psVar5 = psVar5 + 1;
      if (psVar5 == psVar2) {
        local_48.field_2._M_allocated_capacity = uVar4;
        (*peVar1->_vptr_sink[5])(peVar1);
        if ((long *)local_48.field_2._M_allocated_capacity == (long *)0x0) goto LAB_00114cfe;
        lVar3 = *(long *)local_48.field_2._M_allocated_capacity;
        uVar4 = local_48.field_2._M_allocated_capacity;
        goto LAB_00114cfb;
      }
      (**(code **)(*(long *)uVar4 + 0x18))(&local_48._M_string_length,uVar4);
      (*peVar1->_vptr_sink[5])(peVar1,&local_48._M_string_length);
      if ((long *)local_48._M_string_length != (long *)0x0) {
        (**(code **)(*(long *)local_48._M_string_length + 8))();
      }
      local_48._M_string_length = 0;
      psVar2 = (this->sinks_).
               super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (psVar5 != psVar2);
  }
  lVar3 = *(long *)uVar4;
LAB_00114cfb:
  (**(code **)(lVar3 + 8))(uVar4);
LAB_00114cfe:
  if ((pattern_formatter *)local_48._M_dataplus._M_p != (pattern_formatter *)0x0) {
    std::default_delete<spdlog::pattern_formatter>::operator()
              ((default_delete<spdlog::pattern_formatter> *)&local_48,
               (pattern_formatter *)local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

SPDLOG_INLINE void logger::set_pattern(std::string pattern, pattern_time_type time_type)
{
    auto new_formatter = details::make_unique<pattern_formatter>(std::move(pattern), time_type);
    set_formatter(std::move(new_formatter));
}